

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O3

time_t curl_getdate(char *p,time_t *now)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int *piVar8;
  long lVar9;
  size_t sVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  char **what;
  char **ppcVar16;
  int i;
  uint uVar17;
  bool bVar18;
  int len;
  int minnum;
  int hournum;
  char *end;
  uint local_90;
  int local_8c;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  byte *local_68;
  ushort **local_60;
  byte *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar17 = 0xffffffff;
  local_74 = -1;
  local_78 = -1;
  local_8c = -1;
  bVar1 = *p;
  local_90 = 0xffffffff;
  iVar13 = -1;
  iVar15 = -1;
  if (bVar1 != 0) {
    lVar14 = 0xffffffff;
    local_60 = __ctype_b_loc();
    uVar17 = 0xffffffff;
    local_90 = 0xffffffff;
    local_70 = 0;
    local_88 = 0xffffffff;
    bVar5 = false;
    iVar15 = -1;
    local_68 = (byte *)p;
    do {
      do {
        uVar2 = (*local_60)[bVar1];
        if ((uVar2 & 8) != 0) goto LAB_0051eade;
        bVar1 = ((byte *)p)[1];
        p = (char *)((byte *)p + 1);
      } while (bVar1 != 0);
      uVar2 = **local_60;
LAB_0051eade:
      if ((uVar2 >> 10 & 1) == 0) {
        if ((uVar2 >> 0xb & 1) != 0) {
          local_7c = 0;
          if (local_8c == -1) {
            iVar13 = __isoc99_sscanf(p,"%02d:%02d:%02d%n",&local_74,&local_78,&local_8c,&local_7c);
            if (iVar13 != 3) {
              if ((local_8c != -1) ||
                 (iVar13 = __isoc99_sscanf(p,"%02d:%02d%n",&local_74,&local_78,&local_7c),
                 iVar13 != 2)) goto LAB_0051eb11;
              local_8c = 0;
            }
            p = (char *)((byte *)p + local_7c);
          }
          else {
LAB_0051eb11:
            piVar8 = __errno_location();
            iVar13 = *piVar8;
            *piVar8 = 0;
            lVar9 = strtol(p,(char **)&local_58,10);
            iVar3 = *piVar8;
            if (iVar3 != iVar13) {
              *piVar8 = iVar13;
            }
            if (iVar3 != 0) {
              return -1;
            }
            if (lVar9 - 0x80000000U < 0xffffffff00000000) {
              return -1;
            }
            uVar7 = curlx_sltosi(lVar9);
            lVar9 = (long)local_58 - (long)p;
            if (iVar15 == -1) {
              iVar15 = -1;
              bVar4 = false;
              if (((local_68 < p) && (bVar4 = false, lVar9 == 4)) &&
                 (bVar4 = false, (int)uVar7 < 0x579)) {
                bVar1 = ((byte *)p)[-1];
                lVar9 = 4;
                if ((bVar1 != 0x2d) && (bVar1 != 0x2b)) goto LAB_0051eb80;
                iVar13 = uVar7 + ((int)uVar7 / 100) * -0x28;
                iVar15 = iVar13 * -0x3c;
                if (bVar1 != 0x2b) {
                  iVar15 = iVar13 * 0x3c;
                }
                bVar4 = true;
              }
            }
            else {
LAB_0051eb80:
              bVar4 = false;
            }
            uVar11 = local_90;
            if (((lVar9 == 8) && ((int)local_88 == -1)) &&
               ((uVar17 == 0xffffffff && (local_90 == 0xffffffff)))) {
              local_88 = (ulong)(uint)((int)uVar7 / 10000);
              uVar17 = (uint)(short)((short)((short)uVar7 + (short)((int)uVar7 / 10000) * -10000) /
                                     100 + -1);
              uVar11 = (int)uVar7 % 100;
              bVar4 = true;
            }
            bVar12 = (bool)(uVar11 == 0xffffffff & !bVar5 & ~bVar4);
            bVar18 = uVar7 - 1 < 0x1f;
            local_90 = 0xffffffff;
            if (bVar18) {
              local_90 = uVar7;
            }
            bVar18 = (bool)(bVar18 & bVar12);
            bVar6 = true;
            if (!bVar12) {
              local_90 = uVar11;
              bVar6 = bVar5;
            }
            p = (char *)local_58;
            if (((bVar18 || bVar4) || (!bVar6)) || ((int)local_88 != -1)) {
              bVar5 = bVar6;
              if (!bVar18 && !bVar4) {
                return -1;
              }
            }
            else {
              if ((int)uVar7 < 0x76c) {
                if ((int)uVar7 < 0x47) {
                  uVar7 = uVar7 + 2000;
                }
                else {
                  uVar7 = uVar7 + 0x76c;
                }
              }
              local_88 = (ulong)uVar7;
              bVar5 = local_90 != 0xffffffff;
            }
          }
        }
      }
      else {
        local_48 = 0;
        uStack_40 = 0;
        local_58 = (byte *)0x0;
        uStack_50 = 0;
        iVar13 = __isoc99_sscanf(p,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                                 &local_58);
        if (iVar13 == 0) {
          sVar10 = 0;
        }
        else {
          sVar10 = strlen((char *)&local_58);
        }
        if ((int)lVar14 == -1) {
          ppcVar16 = Curl_wkday;
          if (3 < sVar10) {
            ppcVar16 = weekday;
          }
          lVar14 = 0;
          do {
            iVar13 = Curl_strcasecompare((char *)&local_58,ppcVar16[lVar14]);
            if (iVar13 != 0) goto LAB_0051ed8e;
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 != 7);
          lVar14 = 0xffffffff;
        }
        if (uVar17 == 0xffffffff) {
          uVar17 = 0;
          ppcVar16 = Curl_month;
          do {
            iVar13 = Curl_strcasecompare((char *)&local_58,*ppcVar16);
            if (iVar13 != 0) goto LAB_0051ed8e;
            ppcVar16 = ppcVar16 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar17 != 0xc);
          uVar17 = 0xffffffff;
        }
        if (iVar15 != -1) {
          return -1;
        }
        lVar9 = 0;
        while (iVar13 = Curl_strcasecompare((char *)&local_58,tz[0].name + lVar9), iVar13 == 0) {
          lVar9 = lVar9 + 0xc;
          if ((int)lVar9 == 0x330) {
            return -1;
          }
        }
        iVar15 = *(int *)(tz[0].name + lVar9 + 8) * 0x3c;
LAB_0051ed8e:
        p = (char *)((byte *)p + sVar10);
      }
      bVar1 = *p;
    } while ((bVar1 != 0) && (uVar7 = (uint)local_70, local_70 = (ulong)(uVar7 + 1), uVar7 < 5));
    iVar13 = (int)local_88;
    if (local_8c != -1) goto LAB_0051ef0c;
  }
  local_8c = 0;
  local_74 = 0;
  local_78 = 0;
LAB_0051ef0c:
  if (((local_90 != 0xffffffff) && (uVar17 != 0xffffffff)) && (iVar13 != -1)) {
    if (iVar13 < 0x7b2) {
      return 0;
    }
    if ((((local_8c < 0x3d) && ((int)local_90 < 0x20)) && ((int)uVar17 < 0xc)) &&
       ((local_74 < 0x18 && (local_78 < 0x3c)))) {
      uVar7 = uVar17;
      if ((int)uVar17 < 0) {
        uVar7 = (0xb - uVar17) / 0xc;
        iVar13 = iVar13 + uVar7;
        uVar7 = (uVar7 * 0xc - (0xb - uVar17)) + 0xb;
      }
      uVar17 = iVar13 - (uint)((int)uVar17 < 2);
      lVar14 = (((long)local_74 +
                ((long)(int)local_90 + (ulong)(iVar13 - 0x7b2) * 0x16d +
                 (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar7 * 4) +
                (long)(int)(uVar17 / 400 + ((uVar17 >> 2) - uVar17 / 100) + -0x1dd)) * 0x18) * 0x3c
               + (long)local_78) * 0x3c;
      if (iVar15 == -1) {
        iVar15 = 0;
      }
      lVar9 = 0;
      if (local_8c + (int)lVar14 != 0x1517f) {
        lVar9 = (long)iVar15;
      }
      return lVar9 + lVar14 + local_8c + -0x15180;
    }
  }
  return -1;
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed = -1;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  switch(rc) {
  case PARSEDATE_OK:
  case PARSEDATE_LATER:
  case PARSEDATE_SOONER:
    return parsed;
  }
  /* everything else is fail */
  return -1;
}